

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O3

bool __thiscall
CDBIterator::GetKey<(anonymous_namespace)::DBHeightKey>(CDBIterator *this,DBHeightKey *key)

{
  char *pcVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  DataStream ssKey;
  uint8_t obj;
  DataStream local_50;
  uint local_30 [2];
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sp = GetKeyImpl(this);
  DataStream::DataStream(&local_50,sp);
  DataStream::read(&local_50,(int)local_30,(void *)0x1,in_RCX);
  if ((char)local_30[0] == 't') {
    DataStream::read(&local_50,(int)local_30,(void *)0x4,in_RCX);
    key->height = local_30[0] >> 0x18 | (local_30[0] & 0xff0000) >> 8 | (local_30[0] & 0xff00) << 8
                  | local_30[0] << 0x18;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return true;
    }
  }
  else {
    pcVar1 = (char *)__cxa_allocate_exception(0x20);
    local_28 = std::iostream_category();
    local_30[0] = 1;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar1,(error_code *)"Invalid format for block filter index DB height key");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool GetKey(K& key) {
        try {
            DataStream ssKey{GetKeyImpl()};
            ssKey >> key;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }